

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_config.cpp
# Opt level: O2

void __thiscall duckdb::ClientConfig::SetDefaultStreamingBufferSize(ClientConfig *this)

{
  optional_idx oVar1;
  idx_t iVar2;
  optional_idx memory;
  optional_idx local_210;
  ClientConfig local_208;
  
  oVar1 = FileSystem::GetAvailableMemory();
  local_210 = oVar1;
  switchD_0049f7f1::default(&local_208,0,0x1e8);
  ClientConfig(&local_208);
  ~ClientConfig(&local_208);
  if (oVar1.index != 0xffffffffffffffff) {
    iVar2 = optional_idx::GetIndex(&local_210);
    if (iVar2 < local_208.streaming_buffer_size) {
      local_208.streaming_buffer_size = iVar2;
    }
  }
  this->streaming_buffer_size = local_208.streaming_buffer_size;
  return;
}

Assistant:

void ClientConfig::SetDefaultStreamingBufferSize() {
	auto memory = FileSystem::GetAvailableMemory();
	auto default_size = ClientConfig().streaming_buffer_size;
	if (!memory.IsValid()) {
		streaming_buffer_size = default_size;
		return;
	}
	streaming_buffer_size = MinValue(memory.GetIndex(), default_size);
}